

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_map.cpp
# Opt level: O2

void __thiscall r_exec::BindingMap::BindingMap(BindingMap *this,BindingMap *source)

{
  (this->super__Object).refCount.super___atomic_base<long>._M_i = 0;
  (this->super__Object)._vptr__Object = (_func_int **)&PTR__HLPBindingMap_001d0150;
  (this->map).super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->map).super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->map).super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  operator=(this,source);
  return;
}

Assistant:

_Fact *BindingMap::abstract_f_ihlp(_Fact *f_ihlp) const   // bindings are set already (coming from a mk.rdx caught by auto-focus).
{
    uint16_t opcode;
    Code *ihlp = f_ihlp->get_reference(0);

    if (ihlp->code(0).asOpcode() == Opcodes::ICst) {
        opcode = Opcodes::ICst;
    } else {
        opcode = Opcodes::IMdl;
    }

    _Fact *_f_ihlp = new Fact();

    for (uint16_t i = 0; i < f_ihlp->code_size(); ++i) {
        _f_ihlp->code(i) = f_ihlp->code(i);
    }

    Code *_ihlp = _Mem::Get()->build_object(Atom::Object(opcode, I_HLP_ARITY));
    _ihlp->code(I_HLP_OBJ) = Atom::RPointer(0);
    uint16_t extent_index = I_HLP_ARITY + 1;
    uint64_t map_index = 0;
    uint16_t tpl_arg_set_index = ihlp->code(I_HLP_TPL_ARGS).asIndex();
    uint16_t tpl_arg_count = ihlp->code(tpl_arg_set_index).getAtomCount();
    _ihlp->code(I_HLP_TPL_ARGS) = Atom::IPointer(extent_index);
    _ihlp->code(extent_index) = Atom::Set(tpl_arg_count);

    for (uint16_t i = 1; i <= tpl_arg_count; ++i) {
        _ihlp->code(extent_index + i) = Atom::VLPointer(map_index++);
    }

    extent_index += tpl_arg_count;
    uint16_t arg_set_index = ihlp->code(I_HLP_ARGS).asIndex();
    uint16_t arg_count = ihlp->code(arg_set_index).getAtomCount();
    _ihlp->code(I_HLP_ARGS) = Atom::IPointer(extent_index);
    _ihlp->code(extent_index) = Atom::Set(arg_count);

    for (uint16_t i = 1; i <= arg_count; ++i) {
        _ihlp->code(extent_index + i) = Atom::VLPointer(map_index++);
    }

    _ihlp->code(I_HLP_ARITY) = ihlp->code(I_HLP_ARITY);
    _ihlp->add_reference(f_ihlp->get_reference(f_ihlp->code(I_HLP_OBJ).asIndex()));
    _f_ihlp->add_reference(_ihlp);
    return _f_ihlp;
}